

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O0

void __thiscall
libcellml::Validator::ValidatorImpl::validateImportSource
          (ValidatorImpl *this,ImportSourcePtr *importSource,string *importName,string *importType)

{
  IssueImpl *pIVar1;
  bool bVar2;
  element_type *peVar3;
  ulong uVar4;
  undefined8 uVar5;
  element_type *peVar6;
  element_type *peVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  undefined1 local_210 [8];
  IssuePtr issue_2;
  xmlURIPtr uri;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined1 local_178 [8];
  IssuePtr issue_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [8];
  IssuePtr issue;
  string local_68;
  undefined1 local_48 [8];
  string url;
  string *importType_local;
  string *importName_local;
  ImportSourcePtr *importSource_local;
  ValidatorImpl *this_local;
  
  url.field_2._8_8_ = importType;
  peVar3 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)importSource);
  ImportSource::url_abi_cxx11_((string *)local_48,peVar3);
  peVar3 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)importSource);
  Entity::id_abi_cxx11_(&local_68,&peVar3->super_Entity);
  bVar2 = isValidXmlName(&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    Issue::IssueImpl::create();
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,XML_ID_ATTRIBUTE);
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    peVar7 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar6->mPimpl->mItem);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar7->mPimpl,importSource);
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_88);
    pIVar1 = peVar6->mPimpl;
    std::operator+(&local_148,"Import of ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   url.field_2._8_8_);
    std::operator+(&local_128,&local_148," \'");
    std::operator+(&local_108,&local_128,importName);
    std::operator+(&local_e8,&local_108,"\' does not have a valid \'id\' attribute, \'");
    peVar3 = std::
             __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)importSource);
    Entity::id_abi_cxx11_
              ((string *)
               &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ,&peVar3->super_Entity);
    std::operator+(&local_c8,&local_e8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
    std::operator+(&local_a8,&local_c8,"\'.");
    Issue::IssueImpl::setDescription(pIVar1,&local_a8);
    std::__cxx11::string::~string((string *)&local_a8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string
              ((string *)
               &issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_88);
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_88);
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    uVar5 = std::__cxx11::string::c_str();
    issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)xmlParseURI(uVar5);
    if (issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      Issue::IssueImpl::create();
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_210);
      pIVar1 = peVar6->mPimpl;
      std::operator+(&local_290,"Import of ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     url.field_2._8_8_);
      std::operator+(&local_270,&local_290," \'");
      std::operator+(&local_250,&local_270,importName);
      std::operator+(&local_230,&local_250,"\' has an invalid URI in the xlink:href attribute.");
      Issue::IssueImpl::setDescription(pIVar1,&local_230);
      std::__cxx11::string::~string((string *)&local_230);
      std::__cxx11::string::~string((string *)&local_250);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::string::~string((string *)&local_290);
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_210);
      peVar7 = std::
               __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)&peVar6->mPimpl->mItem);
      AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar7->mPimpl,importSource);
      peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_210);
      Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,IMPORT_HREF_LOCATOR);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_210);
      std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_210);
    }
    else {
      xmlFreeURI(issue_2.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    Issue::IssueImpl::create();
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_178);
    pIVar1 = peVar6->mPimpl;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uri,
                   "Import of ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   url.field_2._8_8_);
    std::operator+(&local_1d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&uri," \'");
    std::operator+(&local_1b8,&local_1d8,importName);
    std::operator+(&local_198,&local_1b8,"\' does not have a valid locator xlink:href attribute.");
    Issue::IssueImpl::setDescription(pIVar1,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&uri);
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_178);
    peVar7 = std::
             __shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar6->mPimpl->mItem);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource(peVar7->mPimpl,importSource);
    peVar6 = std::__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_178);
    Issue::IssueImpl::setReferenceRule(peVar6->mPimpl,IMPORT_HREF_LOCATOR);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,(IssuePtr *)local_178);
    std::shared_ptr<libcellml::Issue>::~shared_ptr((shared_ptr<libcellml::Issue> *)local_178);
  }
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Validator::ValidatorImpl::validateImportSource(const ImportSourcePtr &importSource, const std::string &importName, const std::string &importType)
{
    std::string url = importSource->url();

    // Check for a valid identifier.
    if (!isValidXmlName(importSource->id())) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::XML_ID_ATTRIBUTE);
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setDescription("Import of " + importType + " '" + importName + "' does not have a valid 'id' attribute, '" + importSource->id() + "'.");
        addIssue(issue);
    }

    if (url.empty()) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Import of " + importType + " '" + importName + "' does not have a valid locator xlink:href attribute.");
        issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_HREF_LOCATOR);
        addIssue(issue);
    } else {
        xmlURIPtr uri = xmlParseURI(url.c_str());
        if (uri == nullptr) {
            auto issue = Issue::IssueImpl::create();
            issue->mPimpl->setDescription("Import of " + importType + " '" + importName + "' has an invalid URI in the xlink:href attribute.");
            issue->mPimpl->mItem->mPimpl->setImportSource(importSource);
            issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORT_HREF_LOCATOR);
            addIssue(issue);

        } else {
            xmlFreeURI(uri);
        }
    }
}